

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O2

void __thiscall Fl_Choice_Type::Fl_Choice_Type(Fl_Choice_Type *this)

{
  Fl_Menu_Type::Fl_Menu_Type(&this->super_Fl_Menu_Type);
  (this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type =
       (_func_int **)&PTR_setlabel_00272800;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Widget_Type::ideal_size(w, h);
    int w1 = o->h() - Fl::box_dh(o->box());
    if (w1 > 20) w1 = 20;
    w1 = (w1 - 4) / 3;
    if (w1 < 1) w1 = 1;
    w += 2 * w1 + o->labelsize() - 4;
    h = (h / 5) * 5;
    if (h < 15) h = 15;
    if (w < (15 + h)) w = 15 + h;
  }